

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTis.c
# Opt level: O0

void Gia_ManTisCollectMffc_rec(Gia_Man_t *p,int Id,Vec_Int_t *vMffc,Vec_Int_t *vLeaves)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *vLeaves_local;
  Vec_Int_t *vMffc_local;
  int Id_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,Id);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,Id);
    iVar1 = Gia_ObjRefNumId(p,Id);
    if (iVar1 < 2) {
      pObj_00 = Gia_ManObj(p,Id);
      iVar1 = Gia_ObjIsCi(pObj_00);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(pObj_00);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTis.c"
                        ,0x74,
                        "void Gia_ManTisCollectMffc_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        iVar1 = Gia_ObjFaninId0(pObj_00,Id);
        Gia_ManTisCollectMffc_rec(p,iVar1,vMffc,vLeaves);
        iVar1 = Gia_ObjFaninId1(pObj_00,Id);
        Gia_ManTisCollectMffc_rec(p,iVar1,vMffc,vLeaves);
        iVar1 = Gia_ObjIsMuxId(p,Id);
        if (iVar1 != 0) {
          iVar1 = Gia_ObjFaninId2(p,Id);
          Gia_ManTisCollectMffc_rec(p,iVar1,vMffc,vLeaves);
        }
        Vec_IntPush(vMffc,Id);
      }
      else {
        Vec_IntPush(vLeaves,Id);
      }
    }
    else {
      Vec_IntPush(vLeaves,Id);
    }
  }
  return;
}

Assistant:

void Gia_ManTisCollectMffc_rec( Gia_Man_t * p, int Id, Vec_Int_t * vMffc, Vec_Int_t * vLeaves )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    if ( Gia_ObjRefNumId(p, Id) > 1 )
    {
        Vec_IntPush( vLeaves, Id );
        return;
    }
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vLeaves, Id );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId0(pObj, Id), vMffc, vLeaves );
    Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId1(pObj, Id), vMffc, vLeaves );
    if ( Gia_ObjIsMuxId(p, Id) )
        Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId2(p, Id), vMffc, vLeaves );
    Vec_IntPush( vMffc, Id );
}